

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_int_noinline<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_int>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,
          write_int_arg<unsigned_int> arg,basic_format_specs<char8_t> *specs,locale_ref loc)

{
  presentation_type pVar1;
  size_t sVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  char *digits;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar6;
  byte *pbVar7;
  char *pcVar8;
  ulong uVar9;
  write_int_arg<unsigned_int> wVar10;
  char *pcVar11;
  buffer<char8_t> *buf;
  ulong uVar12;
  int size;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  format_decimal_result<char8_t_*> fVar18;
  char8_t buffer [10];
  write_int_data<char8_t> data;
  byte local_79;
  undefined1 local_78 [32];
  bool local_58;
  write_int_data<char8_t> local_48;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_38;
  
  pVar1 = specs->type;
  local_38.container = out.container;
  if (pVar1 < string) {
    uVar17 = (ulong)arg >> 0x20;
    uVar16 = arg.prefix;
    uVar13 = arg.abs_value;
    switch(pVar1) {
    case none:
    case dec:
      uVar12 = (ulong)arg & 0xffffffff;
      if (((specs->field_0xa & 1) != 0) &&
         (bVar3 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,char8_t>
                            (&local_38,uVar12,uVar16,specs,loc), bVar3)) {
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)local_38.container;
      }
      bVar6.container = local_38.container;
      uVar14 = 0x1f;
      if ((uVar13 | 1) != 0) {
        for (; (uVar13 | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar15 = *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar14 * 8) + uVar12;
      size = (int)(uVar15 >> 0x20);
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char8_t>::write_int_data(&local_48,size,uVar16,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = uVar15 & 0xffffffff00000000 | uVar12;
        local_78._0_4_ = uVar16;
        bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                          (bVar6,specs,local_48.size,local_48.size,
                           (anon_class_32_3_03e05ccd *)local_78);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
      }
      if (-1 < (long)uVar15) {
        if ((uVar17 != 0) && (((ulong)arg & 0xffffff00000000) != 0)) {
          uVar17 = (local_38.container)->size_;
          uVar16 = uVar16 & 0xffffff;
          do {
            uVar12 = uVar17 + 1;
            uVar15 = uVar17;
            uVar17 = uVar12;
            if ((bVar6.container)->capacity_ < uVar12) {
              (**(bVar6.container)->_vptr_buffer)(bVar6.container);
              uVar15 = (bVar6.container)->size_;
              uVar17 = uVar15 + 1;
            }
            (bVar6.container)->size_ = uVar17;
            (bVar6.container)->ptr_[uVar15] = (char8_t)uVar16;
            bVar3 = 0xff < uVar16;
            uVar16 = uVar16 >> 8;
          } while (bVar3);
        }
        fVar18 = format_decimal<char8_t,unsigned_int>(local_78,uVar13,size);
        bVar6 = copy_str_noinline<char8_t,char8_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                          (local_78,fVar18.end,bVar6);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
      }
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    case oct:
      uVar14 = 0x1f;
      if ((uVar13 | 1) != 0) {
        for (; (uVar13 | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar14 = uVar14 & 0xff;
      bVar4 = (char)(uVar14 * 0x56 >> 8) + 1;
      uVar12 = (ulong)bVar4;
      if (((specs->field_0x9 & 0x80) != 0) && (uVar13 != 0 && specs->precision <= (int)(uint)bVar4))
      {
        uVar13 = 0x3000;
        if (uVar17 == 0) {
          uVar13 = 0x30;
        }
        uVar17 = (ulong)((uVar13 | uVar16) + 0x1000000);
      }
      uVar13 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char8_t>::write_int_data(&local_48,(uint)bVar4,uVar13,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = (ulong)arg & 0xffffffff | uVar12 << 0x20;
        local_78._0_4_ = uVar13;
        bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                          (out,specs,local_48.size,local_48.size,
                           (anon_class_32_3_03e05ccd *)local_78);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
      }
      if ((uVar13 != 0) && ((uVar17 & 0xffffff) != 0)) {
        uVar17 = (out.container)->size_;
        uVar13 = uVar13 & 0xffffff;
        do {
          uVar15 = uVar17 + 1;
          uVar9 = uVar17;
          uVar17 = uVar15;
          if ((out.container)->capacity_ < uVar15) {
            (**(out.container)->_vptr_buffer)(out.container);
            uVar9 = (out.container)->size_;
            uVar17 = uVar9 + 1;
          }
          (out.container)->size_ = uVar17;
          (out.container)->ptr_[uVar9] = (char8_t)uVar13;
          bVar3 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar3);
      }
      sVar2 = (out.container)->size_;
      uVar17 = sVar2 + uVar12;
      if (uVar17 <= (out.container)->capacity_) {
        (out.container)->size_ = uVar17;
        if ((out.container)->ptr_ != (char8_t *)0x0) {
          pbVar7 = (byte *)((out.container)->ptr_ + sVar2 + (ulong)uVar14 / 3);
          wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            uVar13 = arg.abs_value;
            *pbVar7 = (byte)arg.abs_value & 7 | 0x30;
            wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 3);
            pbVar7 = pbVar7 + -1;
            arg = wVar10;
          } while (7 < uVar13);
          return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
        }
      }
      pcVar8 = local_78 + uVar12;
      pbVar7 = local_78 + (ulong)uVar14 / 3;
      wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar13 = arg.abs_value;
        *pbVar7 = (byte)arg.abs_value & 7 | 0x30;
        wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 3);
        pbVar7 = pbVar7 + -1;
        arg = wVar10;
      } while (7 < uVar13);
      break;
    case hex_lower:
    case hex_upper:
      local_79 = pVar1 == hex_upper;
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar5 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
        uVar14 = uVar5 << 8;
        if (uVar17 == 0) {
          uVar14 = uVar5;
        }
        uVar17 = (ulong)((uVar14 | uVar16) + 0x2000000);
      }
      uVar16 = 0x1f;
      if ((uVar13 | 1) != 0) {
        for (; (uVar13 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar13 = 8 - ((uVar16 ^ 0x1c) >> 2);
      uVar12 = (ulong)uVar13;
      uVar16 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char8_t>::write_int_data(&local_48,uVar13,uVar16,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = (ulong)arg & 0xffffffff | uVar12 << 0x20;
        local_58 = (bool)local_79;
        local_78._0_4_ = uVar16;
        bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                          (out,specs,local_48.size,local_48.size,
                           (anon_class_40_3_03e05ccd *)local_78);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
      }
      if ((uVar16 != 0) && ((uVar17 & 0xffffff) != 0)) {
        uVar17 = (out.container)->size_;
        uVar13 = uVar16 & 0xffffff;
        do {
          uVar15 = uVar17 + 1;
          uVar9 = uVar17;
          uVar17 = uVar15;
          if ((out.container)->capacity_ < uVar15) {
            (**(out.container)->_vptr_buffer)(out.container);
            uVar9 = (out.container)->size_;
            uVar17 = uVar9 + 1;
          }
          (out.container)->size_ = uVar17;
          (out.container)->ptr_[uVar9] = (char8_t)uVar13;
          bVar3 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar3);
      }
      uVar17 = (out.container)->size_ + uVar12;
      if (uVar17 <= (out.container)->capacity_) {
        (out.container)->size_ = uVar17;
        if ((out.container)->ptr_ != (char8_t *)0x0) {
          pcVar8 = "0123456789abcdef";
          if (pVar1 == hex_upper) {
            pcVar8 = "0123456789ABCDEF";
          }
          pcVar11 = (out.container)->ptr_ + uVar17;
          wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            pcVar11 = pcVar11 + -1;
            uVar13 = arg.abs_value;
            *pcVar11 = pcVar8[uVar13 & 0xf];
            wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 4);
            arg = wVar10;
          } while (0xf < uVar13);
          return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
        }
      }
      pcVar8 = local_78 + uVar12;
      pcVar11 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar11 = "0123456789ABCDEF";
      }
      pbVar7 = &local_79 + uVar12;
      wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar13 = arg.abs_value;
        *pbVar7 = pcVar11[uVar13 & 0xf];
        wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 4);
        pbVar7 = pbVar7 + -1;
        arg = wVar10;
      } while (0xf < uVar13);
      break;
    case bin_lower:
    case bin_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar5 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
        uVar14 = uVar5 << 8;
        if (uVar17 == 0) {
          uVar14 = uVar5;
        }
        uVar17 = (ulong)((uVar14 | uVar16) + 0x2000000);
      }
      uVar16 = 0x1f;
      if ((uVar13 | 1) != 0) {
        for (; (uVar13 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar13 = (uVar16 ^ 0xffffffe0) + 0x21;
      uVar12 = (ulong)uVar13;
      uVar16 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char8_t>::write_int_data(&local_48,uVar13,uVar16,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = (ulong)arg & 0xffffffff | uVar12 << 0x20;
        local_78._0_4_ = uVar16;
        bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                          (out,specs,local_48.size,local_48.size,
                           (anon_class_32_3_03e05ccd *)local_78);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
      }
      if ((uVar16 != 0) && ((uVar17 & 0xffffff) != 0)) {
        uVar17 = (out.container)->size_;
        uVar13 = uVar16 & 0xffffff;
        do {
          uVar15 = uVar17 + 1;
          uVar9 = uVar17;
          uVar17 = uVar15;
          if ((out.container)->capacity_ < uVar15) {
            (**(out.container)->_vptr_buffer)(out.container);
            uVar9 = (out.container)->size_;
            uVar17 = uVar9 + 1;
          }
          (out.container)->size_ = uVar17;
          (out.container)->ptr_[uVar9] = (char8_t)uVar13;
          bVar3 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar3);
      }
      uVar17 = (out.container)->size_ + uVar12;
      if (uVar17 <= (out.container)->capacity_) {
        (out.container)->size_ = uVar17;
        if ((out.container)->ptr_ != (char8_t *)0x0) {
          pbVar7 = (byte *)((out.container)->ptr_ + uVar17);
          wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            pbVar7 = pbVar7 + -1;
            uVar13 = arg.abs_value;
            *pbVar7 = (byte)arg.abs_value & 1 | 0x30;
            wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 1);
            arg = wVar10;
          } while (1 < uVar13);
          return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
        }
      }
      pcVar8 = local_78 + uVar12;
      pbVar7 = &local_79 + uVar12;
      wVar10 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar13 = arg.abs_value;
        *pbVar7 = (byte)arg.abs_value & 1 | 0x30;
        wVar10 = (write_int_arg<unsigned_int>)((ulong)wVar10 >> 1);
        pbVar7 = pbVar7 + -1;
        arg = wVar10;
      } while (1 < uVar13);
      break;
    default:
      goto switchD_0017ee06_caseD_7;
    case chr:
      local_78[0] = (char)arg.abs_value;
      bVar6 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_char<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::basic_format_specs<char8_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,1,1,(anon_class_1_1_a8c68091 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
    }
    bVar6 = copy_str_noinline<char8_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                      (local_78,pcVar8,out);
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
  }
switchD_0017ee06_caseD_7:
  fmt::v8::detail::throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}